

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlphaVector.h
# Opt level: O0

void __thiscall AlphaVector::SetBetaI(AlphaVector *this,BGPolicyIndex betaI)

{
  undefined8 uVar1;
  long in_RSI;
  char *in_RDI;
  E *unaff_retaddr;
  
  if (in_RSI < -1) {
    uVar1 = __cxa_allocate_exception(0x28);
    E::E(unaff_retaddr,in_RDI);
    __cxa_throw(uVar1,&E::typeinfo,E::~E);
  }
  *(long *)(in_RDI + 8) = in_RSI;
  return;
}

Assistant:

void SetBetaI(BGPolicyIndex betaI)
        {
            if(betaI<-1)
                throw(E("AlphaVector::SetBetaI() BG policy index has to be >=-1"));
            _m_betaI=betaI;
        }